

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObject
          (ShadingWriter *this,PDFMatrix *inShadingMatrix,ObjectIDType inPatternObjectId,
          ObjectIDType *outShadingObjectId)

{
  EStatusCode EVar1;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  allocator<char> local_51;
  string local_50;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  EVar1 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inPatternObjectId);
  if (EVar1 == eSuccess) {
    this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Type",&local_51);
    DictionaryContext::WriteKey(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Pattern",&local_51);
    DictionaryContext::WriteNameValue(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"PatternType",&local_51);
    DictionaryContext::WriteKey(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    DictionaryContext::WriteIntegerValue(this_01,2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Matrix",&local_51);
    DictionaryContext::WriteKey(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->a,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->b,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->c,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->d,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->e,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble(this->mObjectsContext,inShadingMatrix->f,eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Shading",&local_51);
    DictionaryContext::WriteKey(this_01,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    DictionaryContext::WriteNewObjectReferenceValue(this_01,inObjectReference);
    EVar1 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
    }
    *outShadingObjectId = inObjectReference;
  }
  return EVar1;
}

Assistant:

EStatusCode ShadingWriter::WriteShadingPatternObject(
    const PDFMatrix& inShadingMatrix,
    ObjectIDType inPatternObjectId,
    ObjectIDType& outShadingObjectId
) {
    ObjectIDType shadingObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    EStatusCode status = mObjectsContext->StartNewIndirectObject(inPatternObjectId);
    if(status != eSuccess)
        return status;
    DictionaryContext* patternDict = mObjectsContext->StartDictionary();
    patternDict->WriteKey("Type");
    patternDict->WriteNameValue("Pattern");
    patternDict->WriteKey("PatternType");
    patternDict->WriteIntegerValue(2);
    patternDict->WriteKey("Matrix");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inShadingMatrix.a);
    mObjectsContext->WriteDouble(inShadingMatrix.b);
    mObjectsContext->WriteDouble(inShadingMatrix.c);
    mObjectsContext->WriteDouble(inShadingMatrix.d);
    mObjectsContext->WriteDouble(inShadingMatrix.e);
    mObjectsContext->WriteDouble(inShadingMatrix.f);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);
    patternDict->WriteKey("Shading");
    patternDict->WriteNewObjectReferenceValue(shadingObjectId);
    status = mObjectsContext->EndDictionary(patternDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outShadingObjectId = shadingObjectId;

    return status;
}